

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

void __thiscall CTcPrsGramNodeCat::flatten_cat(CTcPrsGramNodeCat *this)

{
  CTcPrsGramNode *pCVar1;
  CTcPrsGramNode *pCVar2;
  int iVar3;
  CTcPrsGramNode **ppCVar4;
  CTcPrsGramNode *pCVar5;
  CTcPrsGramNode *pCVar6;
  bool bVar7;
  
  pCVar6 = (this->super_CTcPrsGramNodeWithChildren).sub_head_;
  if (pCVar6 != (CTcPrsGramNode *)0x0) {
    pCVar5 = (CTcPrsGramNode *)0x0;
    do {
      pCVar1 = pCVar6->next_;
      (*(pCVar6->super_CTcTokenSource)._vptr_CTcTokenSource[4])(pCVar6);
      iVar3 = (*(pCVar6->super_CTcTokenSource)._vptr_CTcTokenSource[6])(pCVar6);
      if (iVar3 != 0) {
        pCVar2 = (CTcPrsGramNode *)pCVar6[1].super_CTcTokenSource._vptr_CTcTokenSource;
        ppCVar4 = &pCVar5->next_;
        if (pCVar5 == (CTcPrsGramNode *)0x0) {
          ppCVar4 = &(this->super_CTcPrsGramNodeWithChildren).sub_head_;
        }
        if (pCVar2 == (CTcPrsGramNode *)0x0) {
          *ppCVar4 = pCVar1;
          bVar7 = (this->super_CTcPrsGramNodeWithChildren).sub_tail_ == pCVar6;
          pCVar6 = pCVar5;
          if (bVar7) {
            (this->super_CTcPrsGramNodeWithChildren).sub_tail_ = pCVar5;
          }
        }
        else {
          *ppCVar4 = pCVar2;
          pCVar6[1].super_CTcTokenSource.enclosing_src_[1]._vptr_CTcTokenSource =
               (_func_int **)pCVar1;
          if ((this->super_CTcPrsGramNodeWithChildren).sub_tail_ == pCVar6) {
            (this->super_CTcPrsGramNodeWithChildren).sub_tail_ =
                 (CTcPrsGramNode *)pCVar6[1].super_CTcTokenSource.enclosing_src_;
          }
          pCVar6 = (CTcPrsGramNode *)pCVar6[1].super_CTcTokenSource.enclosing_src_;
        }
      }
      pCVar5 = pCVar6;
      pCVar6 = pCVar1;
    } while (pCVar1 != (CTcPrsGramNode *)0x0);
  }
  return;
}

Assistant:

virtual void flatten_cat()
    {
        CTcPrsGramNode *prv;
        CTcPrsGramNode *cur;
        CTcPrsGramNode *nxt;
        
        /*
         *   Check each child.  For each child that's a CAT node, move its
         *   contents directly into our list, removing the redundant
         *   intervening CAT node. 
         */
        for (prv = 0, cur = sub_head_ ; cur != 0 ; cur = nxt)
        {
            /* note the next item, in case we fiddle with the list */
            nxt = cur->next_;

            /* flatten the CAT items below this one */
            cur->flatten_cat();

            /* if this item is a CAT, move its contents directly into us */
            if (cur->is_cat())
            {
                CTcPrsGramNodeCat *cur_cat;
                
                /* cast it to a CAT node */
                cur_cat = (CTcPrsGramNodeCat *)cur;

                /* if it's empty, just remove it; otherwise, link it in */
                if (cur_cat->sub_head_ != 0)
                {
                    /* link from the previous item to the sublist head */
                    if (prv == 0)
                    {
                        /* 
                         *   this is the first item - put it at the start of
                         *   our list 
                         */
                        sub_head_ = cur_cat->sub_head_;
                    }
                    else
                    {
                        /* link it after the previous item */
                        prv->next_ = cur_cat->sub_head_;
                    }
                    
                    /* link from the tail of the sublist to the next item */
                    cur_cat->sub_tail_->next_ = nxt;
                    
                    /* if it's the last item, set our tail pointer */
                    if (sub_tail_ == cur)
                        sub_tail_ = cur_cat->sub_tail_;
                    
                    /* 
                     *   the tail of the sublist is now the previous item in
                     *   the list for the purposes of the next iteration 
                     */
                    prv = cur_cat->sub_tail_;
                }
                else
                {
                    /* unlink it from our list */
                    if (prv != 0)
                        prv->next_ = nxt;
                    else
                        sub_head_ = nxt;

                    /* update the tail pointer if removing the last item */
                    if (sub_tail_ == cur_cat)
                        sub_tail_ = prv;

                    /* note that the previous item is unchanged */
                }
            }
            else
            {
                /* 
                 *   it's not a CAT, so we're not changing it; this is the
                 *   previous item for the next iteration 
                 */
                prv = cur;
            }
        }
    }